

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buffer,QSpanData *data,int y,int x,int length)

{
  uint *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  long lVar6;
  uchar *puVar7;
  double dVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar19 = (double)x + 0.5;
  dVar16 = (double)y + 0.5;
  bVar9 = canUseFastMatrixPath(dVar19,dVar16,(long)length,data);
  dVar2 = data->m11;
  if (bVar9) {
    iVar14 = (int)(data->m12 * 65536.0);
    iVar15 = (int)((data->dx + data->m21 * dVar16 + dVar19 * dVar2) * 65536.0);
    iVar17 = (int)((data->dy + data->m22 * dVar16 + dVar19 * data->m12) * 65536.0);
    if (iVar14 == 0) {
      iVar17 = iVar17 >> 0x10;
      uVar5 = (data->field_23).texture.height;
      if (iVar17 < 0 || (int)uVar5 <= iVar17) {
        iVar17 = (iVar17 % (int)uVar5 >> 0x1f & uVar5) + iVar17 % (int)uVar5;
      }
      lVar6 = (data->field_23).texture.bytesPerLine;
      puVar7 = (data->field_23).texture.imageData;
      uVar12 = 0;
      uVar13 = (ulong)(uint)length;
      if (length < 1) {
        uVar13 = uVar12;
      }
      for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        iVar14 = iVar15 >> 0x10;
        uVar5 = (data->field_23).texture.width;
        if (iVar14 < 0 || (int)uVar5 <= iVar14) {
          iVar14 = (iVar14 % (int)uVar5 >> 0x1f & uVar5) + iVar14 % (int)uVar5;
        }
        buffer[uVar12] = *(uint *)(puVar7 + (long)iVar14 * 4 + iVar17 * lVar6);
        iVar15 = iVar15 + (int)(dVar2 * 65536.0);
      }
    }
    else {
      uVar12 = 0;
      uVar13 = (ulong)(uint)length;
      if (length < 1) {
        uVar13 = uVar12;
      }
      for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        iVar11 = iVar15 >> 0x10;
        uVar5 = (data->field_23).texture.width;
        if (iVar11 < 0 || (int)uVar5 <= iVar11) {
          iVar11 = (iVar11 % (int)uVar5 >> 0x1f & uVar5) + iVar11 % (int)uVar5;
        }
        iVar10 = iVar17 >> 0x10;
        uVar5 = (data->field_23).texture.height;
        if (iVar10 < 0 || (int)uVar5 <= iVar10) {
          iVar10 = (iVar10 % (int)uVar5 >> 0x1f & uVar5) + iVar10 % (int)uVar5;
        }
        buffer[uVar12] =
             *(uint *)((data->field_23).texture.imageData +
                      (long)iVar11 * 4 + (long)iVar10 * (data->field_23).texture.bytesPerLine);
        iVar15 = iVar15 + (int)(dVar2 * 65536.0);
        iVar17 = iVar17 + iVar14;
      }
    }
  }
  else {
    dVar3 = data->m13;
    dVar4 = data->m12;
    dVar20 = dVar16 * data->m23 + dVar19 * dVar3 + data->m33;
    dVar18 = data->dx + dVar16 * data->m21 + dVar19 * dVar2;
    dVar19 = data->dy + dVar16 * data->m22 + dVar19 * dVar4;
    puVar1 = buffer + length;
    for (; buffer < puVar1; buffer = buffer + 1) {
      dVar8 = (double)(-(ulong)(dVar20 == 0.0) & 0x3ff0000000000000 |
                      ~-(ulong)(dVar20 == 0.0) & (ulong)(1.0 / dVar20));
      dVar16 = floor(dVar18 * dVar8);
      dVar8 = floor(dVar19 * dVar8);
      iVar17 = (int)dVar8;
      uVar5 = (data->field_23).texture.height;
      if (iVar17 < 0 || (int)uVar5 <= iVar17) {
        iVar17 = (iVar17 % (int)uVar5 >> 0x1f & uVar5) + iVar17 % (int)uVar5;
      }
      iVar15 = (int)dVar16;
      uVar5 = (data->field_23).texture.width;
      if (iVar15 < 0 || (int)uVar5 <= iVar15) {
        iVar15 = (iVar15 % (int)uVar5 >> 0x1f & uVar5) + iVar15 % (int)uVar5;
      }
      *buffer = *(uint *)((data->field_23).texture.imageData +
                         (long)iVar15 * 4 + (long)iVar17 * (data->field_23).texture.bytesPerLine);
      dVar18 = dVar18 + dVar2;
      dVar19 = dVar19 + dVar4;
      dVar20 = dVar20 + dVar3;
      dVar20 = (double)((ulong)dVar20 & -(ulong)(dVar20 != 0.0) |
                       ~-(ulong)(dVar20 != 0.0) & (ulong)(dVar3 + dVar20));
    }
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformed_fetcher(T *buffer, const QSpanData *data,
                                                 int y, int x, int length)
{
    static_assert(blendType == BlendTransformed || blendType == BlendTransformedTiled);
    const QTextureData &image = data->texture;

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    constexpr bool useFetch = (bpp < QPixelLayout::BPP32) && sizeof(T) == sizeof(uint);
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (!useFetch)
        Q_ASSERT(layout->bpp == bpp || (layout->bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    // When templated 'fetch' should be inlined at compile time:
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout->bpp] : Fetch1PixelFunc(fetch1Pixel<bpp>);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        if (fdy == 0) { // simple scale, no rotation or shear
            int py = (fy >> 16);
            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            const uchar *src = image.scanLine(py);

            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int x2 = x1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    if (x1 == x2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[x1];
                    fx += fdx;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[px];
                    fx += fdx;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                if constexpr (useFetch)
                    buffer[i] = fetch1(src, px);
                else
                    buffer[i] = reinterpret_cast<const T*>(src)[px];
                fx += fdx;
            }
        } else { // rotation or shear
            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
                if (fdy > 0)
                    fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
                else if (fdy < 0)
                    fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int y1 = (fy >> 16);
                    int x2 = x1;
                    int y2 = y1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1);
                    if (x1 == x2 && y1 == y2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(y1), x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(y1))[x1];
                    fx += fdx;
                    fy += fdy;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    int py = (fy >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(py), px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                    fx += fdx;
                    fy += fdy;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                int py = (fy >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
                if constexpr (useFetch)
                    buffer[i] = fetch1(image.scanLine(py), px);
                else
                    buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                fx += fdx;
                fy += fdy;
            }
        }
    } else {
        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        T *const end = buffer + length;
        T *b = buffer;
        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal tx = fx * iw;
            const qreal ty = fy * iw;
            int px = qFloor(tx);
            int py = qFloor(ty);

            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
            if constexpr (useFetch)
                *b = fetch1(image.scanLine(py), px);
            else
                *b = reinterpret_cast<const T*>(image.scanLine(py))[px];

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }
}